

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall
crnlib::crn_comp::optimize_alpha_endpoints_task(crn_comp *this,uint64 data,void *pData_ptr)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  level_details *plVar6;
  endpoint_indices_details *peVar7;
  ushort uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  uint orig_size;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  byte bVar19;
  ulong uVar20;
  ulong uVar21;
  uint16 i_1;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  crn_comp *this_00;
  vector<unsigned_short> *pvVar25;
  uint16 i;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  vector<unsigned_int> hist;
  static_huffman_data_model dm;
  symbol_codec codec;
  elemental_vector local_188;
  vector<unsigned_short> *local_170;
  crn_comp *local_168;
  void *local_160;
  void *local_158;
  undefined8 uStack_150;
  uchar *local_140;
  uint local_138;
  ulong local_120;
  ulong local_118;
  long local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  long local_f0;
  symbol_codec local_e8;
  unsigned_short *local_50;
  void *local_48;
  ulong local_40;
  long local_38;
  
  pvVar25 = *(vector<unsigned_short> **)((long)pData_ptr + 0x18);
  uVar5 = *(ushort *)((long)pData_ptr + 0x10);
  uVar17 = (ulong)uVar5;
  uVar13 = pvVar25->m_size;
  uVar27 = (uint)uVar5;
  uVar14 = (uint)uVar5;
  local_170 = pvVar25;
  local_168 = this;
  if (uVar13 != uVar5) {
    if (uVar13 <= uVar5) {
      if (pvVar25->m_capacity < uVar14) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar25,uVar27,uVar13 + 1 == uVar14,2,(object_mover)0x0,false
                  );
        uVar13 = pvVar25->m_size;
      }
      memset(pvVar25->m_p + uVar13,0,(ulong)(uVar27 - uVar13) * 2);
    }
    local_170->m_size = uVar27;
  }
  if (data == 0) {
    lVar1 = *pData_ptr;
    local_e8.m_pDecode_buf = (uint8 *)0x0;
    local_e8.m_pDecode_buf_next = (uint8 *)0x0;
    this_00 = local_168;
    pvVar25 = local_170;
    if (uVar17 != 0) {
      uVar13 = (uint)uVar5;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_e8,uVar13,uVar13 == 1,2,(object_mover)0x0,false);
      uVar14 = (uint)uVar5;
      local_e8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,uVar14);
      local_158 = (void *)0x0;
      uStack_150 = (unsigned_short *)0x0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_158,uVar14,uVar13 == 1,2,(object_mover)0x0,false);
      uVar24 = 0;
      memset((void *)(((ulong)uStack_150 & 0xffffffff) * 2 + (long)local_158),0,
             (ulong)(uVar14 - (uint)uStack_150) * 2);
      this_00 = local_168;
      pvVar25 = local_170;
      uStack_150 = (unsigned_short *)CONCAT44(uStack_150._4_4_,uVar14);
      do {
        *(ushort *)((long)local_e8.m_pDecode_buf + uVar24 * 2) = *(ushort *)(lVar1 + uVar24 * 2);
        *(short *)((long)local_158 + uVar24 * 2) = (short)uVar24;
        uVar24 = uVar24 + 1;
      } while (uVar17 != uVar24);
      bVar12 = 0;
      bVar19 = 0;
      uVar24 = uVar17;
      do {
        uVar14 = 0xffffffff;
        uVar20 = 0;
        uVar13 = 0;
        do {
          iVar9 = (uint)(byte)*(ushort *)((long)local_e8.m_pDecode_buf + uVar20 * 2) - (uint)bVar12;
          iVar26 = (uint)*(byte *)((long)local_e8.m_pDecode_buf + uVar20 * 2 + 1) - (uint)bVar19;
          uVar27 = iVar26 * iVar26 + iVar9 * iVar9;
          if (uVar27 < uVar14) {
            uVar14 = uVar27;
            uVar13 = (uint)uVar20;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < uVar24);
        uVar20 = (ulong)((uVar13 & 0xffff) * 2);
        bVar12 = *(byte *)((long)local_e8.m_pDecode_buf + uVar20);
        bVar19 = *(byte *)((long)local_e8.m_pDecode_buf + uVar20 + 1);
        local_170->m_p[*(ushort *)((long)local_158 + uVar20)] = uVar5 - (short)uVar24;
        *(ushort *)((long)local_e8.m_pDecode_buf + uVar20) =
             *(ushort *)((long)local_e8.m_pDecode_buf + (uVar24 - 1) * 2);
        *(undefined2 *)((long)local_158 + uVar20) =
             *(undefined2 *)((long)local_158 + uVar24 * 2 + -2);
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
      if (local_158 != (void *)0x0) {
        crnlib_free(local_158);
      }
      if ((ushort *)local_e8.m_pDecode_buf != (ushort *)0x0) {
        crnlib_free(local_e8.m_pDecode_buf);
      }
    }
    optimize_alpha_selectors(this_00);
    goto LAB_00163984;
  }
  local_50 = local_170->m_p;
  local_f0 = *pData_ptr;
  local_110 = *(long *)((long)pData_ptr + 8);
  uVar5 = *(ushort *)((long)pData_ptr + 0x12);
  local_160 = (void *)CONCAT44(local_160._4_4_,*(undefined4 *)((long)pData_ptr + 0x14));
  local_e8.m_pDecode_buf = (uint8 *)0x0;
  local_e8.m_pDecode_buf_next = (uint8 *)0x0;
  local_158 = (void *)0x0;
  uStack_150 = (unsigned_short *)0x0;
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  local_48 = pData_ptr;
  if (uVar17 == 0) {
    local_e8.m_pDecode_buf_next._0_4_ = 0;
LAB_00163515:
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_e8,(uint)local_e8.m_pDecode_buf_next + 1,true,2,
               (object_mover)0x0,false);
    *(ushort *)
     ((long)local_e8.m_pDecode_buf + ((ulong)local_e8.m_pDecode_buf_next & 0xffffffff) * 2) = uVar5;
    local_e8.m_pDecode_buf_next =
         (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,(uint)local_e8.m_pDecode_buf_next + 1);
    if (uVar17 != 0) goto LAB_00163554;
  }
  else {
    elemental_vector::increase_capacity(&local_188,uVar14,uVar27 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
           (ulong)(uVar14 - local_188.m_size) << 2);
    local_188.m_size = uVar27;
    if (local_e8.m_pDecode_buf_next._4_4_ <= (uint)local_e8.m_pDecode_buf_next) goto LAB_00163515;
    *(ushort *)
     ((long)local_e8.m_pDecode_buf + ((ulong)local_e8.m_pDecode_buf_next & 0xffffffff) * 2) = uVar5;
    local_e8.m_pDecode_buf_next =
         (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,(uint)local_e8.m_pDecode_buf_next + 1);
LAB_00163554:
    lVar1 = local_110 + (ulong)(uVar5 * uVar27) * 4;
    uVar24 = 0;
    do {
      if (uVar5 != uVar24) {
        if (uStack_150._4_4_ <= (uint)uStack_150) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_158,(uint)uStack_150 + 1,true,2,(object_mover)0x0,
                     false);
        }
        *(short *)((long)local_158 + (ulong)(uint)uStack_150 * 2) = (short)uVar24;
        uStack_150 = (unsigned_short *)CONCAT44(uStack_150._4_4_,(uint)uStack_150 + 1);
        *(undefined4 *)((long)local_188.m_p + uVar24 * 4) = *(undefined4 *)(lVar1 + uVar24 * 4);
      }
      uVar24 = uVar24 + 1;
    } while (uVar17 != uVar24);
  }
  if ((uint)uStack_150 != 0) {
    local_38 = (long)(local_160._0_4_ * 1000.0 + 1000.0);
    local_f8 = 0;
    local_40 = uVar17;
    do {
      uVar17 = local_40;
      uVar24 = (ulong)local_e8.m_pDecode_buf_next & 0xffffffff;
      uVar13 = (uint)local_e8.m_pDecode_buf_next - 1;
      uVar10 = (ulong)uVar13;
      local_160 = local_188.m_p;
      local_100 = 0;
      uVar16 = 0;
      uVar20 = 0;
      local_118 = 0;
      local_120 = 0;
      do {
        uVar21 = (ulong)*(ushort *)((long)local_158 + (uVar20 & 0xffff) * 2);
        bVar12 = *(byte *)(local_f0 + uVar21 * 2);
        iVar9 = (uint)bVar12 -
                (uint)*(byte *)(local_f0 + (ulong)*(ushort *)local_e8.m_pDecode_buf * 2);
        uVar14 = (uint)*(byte *)(local_f0 + 1 + uVar21 * 2);
        iVar26 = uVar14 - *(byte *)(local_f0 + 1 + (ulong)*(ushort *)local_e8.m_pDecode_buf * 2);
        uVar27 = iVar26 * iVar26 + iVar9 * iVar9;
        if (999 < uVar27) {
          uVar27 = 1000;
        }
        iVar26 = (uint)bVar12 -
                 (uint)*(byte *)(local_f0 +
                                (ulong)*(ushort *)((long)local_e8.m_pDecode_buf + uVar10 * 2) * 2);
        iVar9 = uVar14 - *(byte *)(local_f0 + 1 +
                                  (ulong)*(ushort *)((long)local_e8.m_pDecode_buf + uVar10 * 2) * 2)
        ;
        uVar14 = iVar9 * iVar9 + iVar26 * iVar26;
        if (999 < uVar14) {
          uVar14 = 1000;
        }
        uVar18 = (ulong)((int)local_38 - uVar27);
        uVar28 = (ulong)((int)local_38 - uVar14);
        uVar15 = uVar28;
        if (uVar28 < uVar18) {
          uVar15 = uVar18;
        }
        uVar15 = (uint)(*(int *)((long)local_188.m_p + uVar21 * 4) + (int)local_f8) * uVar15;
        if (uVar16 <= uVar15) {
          uVar16 = uVar15 + 1;
          local_120 = uVar18;
          local_118 = uVar28;
          local_100 = uVar20;
        }
        uVar14 = (int)uVar20 + 1;
        uVar20 = (ulong)uVar14;
      } while ((uVar14 & 0xffff) < (uint)uStack_150);
      uVar8 = (ushort)local_100;
      uVar20 = local_100 & 0xffff;
      uVar5 = *(ushort *)((long)local_158 + uVar20 * 2);
      lVar1 = local_110 + (ulong)((uint)uVar5 * (int)local_40) * 4;
      if ((int)uVar13 < 1) {
        uVar10 = 0;
        uVar16 = 0;
      }
      else {
        uVar21 = 0;
        uVar16 = 0;
        uVar14 = 0;
        do {
          iVar9 = (int)uVar10;
          uVar14 = uVar14 + *(int *)(lVar1 + (ulong)*(ushort *)
                                                     ((long)local_e8.m_pDecode_buf + uVar21 * 2) * 4
                                    ) * iVar9;
          uVar16 = (ulong)(uint)((int)uVar16 +
                                *(int *)(lVar1 + (ulong)*(ushort *)
                                                         ((long)local_e8.m_pDecode_buf +
                                                         (ulong)uVar13 * 2) * 4) * iVar9);
          uVar21 = uVar21 + 1;
          uVar13 = uVar13 - 1;
          uVar10 = (ulong)(iVar9 - 2);
        } while (((uint)local_e8.m_pDecode_buf_next - 2 >> 1) + 1 != uVar21);
        uVar10 = (ulong)uVar14;
      }
      local_f8 = (ulong)*(uint *)((long)local_188.m_p + (ulong)uVar5 * 4);
      local_108 = uVar24;
      if (uVar10 * local_120 < uVar16 * local_118 || uVar10 * local_120 - uVar16 * local_118 == 0) {
        if (local_e8.m_pDecode_buf_next._4_4_ <= (uint)local_e8.m_pDecode_buf_next) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_e8,(uint)local_e8.m_pDecode_buf_next + 1,true,2,
                     (object_mover)0x0,false);
          uVar24 = (ulong)local_e8.m_pDecode_buf_next & 0xffffffff;
        }
        *(ushort *)((long)local_e8.m_pDecode_buf + uVar24 * 2) = uVar5;
        local_e8.m_pDecode_buf_next =
             (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,
                               (uint)local_e8.m_pDecode_buf_next + 1);
      }
      else {
        uVar13 = (uint)local_e8.m_pDecode_buf_next + 1;
        if (uVar13 != 0) {
          if (local_e8.m_pDecode_buf_next._4_4_ < uVar13) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&local_e8,uVar13,true,2,(object_mover)0x0,false);
          }
          memset((ushort *)
                 ((long)local_e8.m_pDecode_buf + (ulong)(uint)local_e8.m_pDecode_buf_next * 2),0,
                 (ulong)(uVar13 - (uint)local_e8.m_pDecode_buf_next) * 2);
        }
        local_e8.m_pDecode_buf_next = (uint8 *)CONCAT44(local_e8.m_pDecode_buf_next._4_4_,uVar13);
        memmove((ushort *)((long)local_e8.m_pDecode_buf + 2),local_e8.m_pDecode_buf,uVar24 * 2);
        *(ushort *)local_e8.m_pDecode_buf = uVar5;
      }
      uVar13 = (uint)uStack_150;
      if (uVar8 < (uint)uStack_150) {
        memmove((void *)((long)local_158 + uVar20 * 2),(void *)((long)local_158 + uVar20 * 2 + 2),
                (ulong)((uint)uStack_150 + ~(uint)uVar8) * 2);
        uVar13 = (uint)uStack_150 - 1;
        uStack_150 = (unsigned_short *)CONCAT44(uStack_150._4_4_,uVar13);
      }
      if (uVar13 == 0) break;
      uVar13 = 1;
      do {
        lVar11 = (ulong)*(ushort *)((long)local_158 + (ulong)(uVar13 - 1 & 0xffff) * 2) * 4;
        piVar2 = (int *)((long)local_188.m_p + lVar11);
        *piVar2 = *piVar2 + *(int *)(lVar1 + lVar11);
        uVar14 = uVar13 & 0xffff;
        uVar13 = uVar13 + 1;
      } while (uVar14 < (uint)uStack_150);
    } while ((uint)uStack_150 != 0);
  }
  pData_ptr = local_48;
  this_00 = local_168;
  pvVar25 = local_170;
  if (uVar17 != 0) {
    uVar24 = 0;
    do {
      local_50[*(ushort *)((long)local_e8.m_pDecode_buf + uVar24 * 2)] = (unsigned_short)uVar24;
      uVar24 = uVar24 + 1;
    } while (uVar17 != uVar24);
  }
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  if (local_158 != (void *)0x0) {
    crnlib_free(local_158);
  }
  if ((ushort *)local_e8.m_pDecode_buf != (ushort *)0x0) {
    crnlib_free(local_e8.m_pDecode_buf);
  }
LAB_00163984:
  pack_alpha_endpoints
            (this_00,(vector<unsigned_char> *)(*(long *)((long)pData_ptr + 0x18) + 0x10),pvVar25);
  iVar9 = *(int *)(*(long *)((long)pData_ptr + 0x18) + 0x18);
  local_188.m_p = (void *)0x0;
  local_188.m_size = 0;
  local_188.m_capacity = 0;
  uVar13 = (uint)uVar17;
  if (uVar17 != 0) {
    elemental_vector::increase_capacity(&local_188,uVar13,uVar13 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_188._8_8_ & 0xffffffff) * 4 + (long)local_188.m_p),0,
           (ulong)(uVar13 - local_188.m_size) << 2);
    local_188.m_size = uVar13;
    this_00 = local_168;
    pvVar25 = local_170;
  }
  uVar14 = (this_00->m_levels).m_size;
  if (uVar14 != 0) {
    bVar3 = this_00->m_has_comp[1];
    bVar4 = this_00->m_has_comp[2];
    uVar24 = 0;
    do {
      plVar6 = (this_00->m_levels).m_p;
      uVar27 = plVar6[uVar24].first_block;
      uVar20 = (ulong)uVar27;
      uVar22 = plVar6[uVar24].num_blocks + uVar27;
      if (uVar27 < uVar22) {
        uVar27 = 0;
        uVar14 = 0;
        do {
          uVar23 = uVar27;
          if ((bVar3 != false) &&
             (peVar7 = (this_00->m_endpoint_indices).m_p,
             uVar23 = (uint)pvVar25->m_p[peVar7[uVar20].field_0.field_0.alpha0],
             peVar7[uVar20].reference == '\0')) {
            piVar2 = (int *)((long)local_188.m_p +
                            (ulong)(((int)(uVar23 - uVar27) >> 0x1f & uVar13) + (uVar23 - uVar27)) *
                            4);
            *piVar2 = *piVar2 + 1;
          }
          uVar27 = uVar23;
          uVar23 = uVar14;
          if (bVar4 != false) {
            peVar7 = (this_00->m_endpoint_indices).m_p;
            uVar5 = pvVar25->m_p[peVar7[uVar20].field_0.field_0.alpha1];
            uVar23 = (uint)uVar5;
            if (peVar7[uVar20].reference == '\0') {
              piVar2 = (int *)((long)local_188.m_p +
                              (ulong)(((int)(uVar5 - uVar14) >> 0x1f & uVar13) + (uVar5 - uVar14)) *
                              4);
              *piVar2 = *piVar2 + 1;
            }
          }
          uVar20 = uVar20 + 1;
          uVar14 = uVar23;
        } while (uVar22 != uVar20);
        uVar14 = (this_00->m_levels).m_size;
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < uVar14);
  }
  static_huffman_data_model::static_huffman_data_model((static_huffman_data_model *)&local_158);
  static_huffman_data_model::init((static_huffman_data_model *)&local_158,(EVP_PKEY_CTX *)0x1);
  if (local_138 == 0) {
    local_140 = (uchar *)0x0;
  }
  iVar9 = iVar9 << 3;
  if ((short)uVar17 != 0) {
    uVar24 = 0;
    do {
      iVar9 = iVar9 + (uint)local_140[uVar24] * *(int *)((long)local_188.m_p + uVar24 * 4);
      uVar24 = uVar24 + 1;
    } while ((uVar17 & 0xffffffff) != uVar24);
  }
  symbol_codec::symbol_codec(&local_e8);
  symbol_codec::start_encoding(&local_e8,0x10000);
  local_e8.m_simulate_encoding = true;
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_e8,(static_huffman_data_model *)&local_158,false,
             (static_huffman_data_model *)0x0);
  symbol_codec::stop_encoding(&local_e8,false);
  *(uint *)(*(long *)((long)pData_ptr + 0x18) + 0x20) = iVar9 + local_e8.m_total_bits_written;
  crnlib_free(pData_ptr);
  if (local_e8.m_output_syms.m_p != (output_symbol *)0x0) {
    crnlib_free(local_e8.m_output_syms.m_p);
  }
  if (local_e8.m_arith_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_e8.m_arith_output_buf.m_p);
  }
  if (local_e8.m_output_buf.m_p != (uchar *)0x0) {
    crnlib_free(local_e8.m_output_buf.m_p);
  }
  static_huffman_data_model::~static_huffman_data_model((static_huffman_data_model *)&local_158);
  if (local_188.m_p != (void *)0x0) {
    crnlib_free(local_188.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_alpha_endpoints_task(uint64 data, void* pData_ptr) {
  optimize_alpha_params* pParams = reinterpret_cast<optimize_alpha_params*>(pData_ptr);
  crnlib::vector<uint16>& remapping = pParams->pResult->endpoint_remapping;
  uint16 n = pParams->n;
  remapping.resize(n);

  if (data) {
    remap_alpha_endpoints(remapping.get_ptr(), pParams->unpacked_endpoints, pParams->hist, n, pParams->selected, pParams->weight);
  } else {
    sort_alpha_endpoints(remapping, pParams->unpacked_endpoints, n);
    optimize_alpha_selectors();
  }

  pack_alpha_endpoints(pParams->pResult->packed_endpoints, remapping);
  uint total_bits = pParams->pResult->packed_endpoints.size() << 3;

  crnlib::vector<uint> hist(n);
  bool hasAlpha0 = m_has_comp[cAlpha0], hasAlpha1 = m_has_comp[cAlpha1];
  for (uint level = 0; level < m_levels.size(); level++) {
    for (uint alpha0_index = 0, alpha1_index = 0, b = m_levels[level].first_block, bEnd = b + m_levels[level].num_blocks; b < bEnd; b++) {
      if (hasAlpha0) {
        uint index = remapping[m_endpoint_indices[b].component[cAlpha0]];
        if (!m_endpoint_indices[b].reference) {
          int sym = index - alpha0_index;
          hist[sym < 0 ? sym + n : sym]++;
        }
        alpha0_index = index;
      }
      if (hasAlpha1) {
        uint index = remapping[m_endpoint_indices[b].component[cAlpha1]];
        if (!m_endpoint_indices[b].reference) {
          int sym = index - alpha1_index;
          hist[sym < 0 ? sym + n : sym]++;
        }
        alpha1_index = index;
      }
    }
  }

  static_huffman_data_model dm;
  dm.init(true, n, hist.get_ptr(), 16);
  const uint8* code_sizes = dm.get_code_sizes();
  for (uint16 s = 0; s < n; s++)
    total_bits += hist[s] * code_sizes[s];

  symbol_codec codec;
  codec.start_encoding(64 * 1024);
  codec.encode_enable_simulation(true);
  codec.encode_transmit_static_huffman_data_model(dm, false);
  codec.stop_encoding(false);
  total_bits += codec.encode_get_total_bits_written();

  pParams->pResult->total_bits = total_bits;

  crnlib_delete(pParams);
}